

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

bool __thiscall storage::BTree::_erase_(BTree *this,int key,Record **out_record)

{
  int iVar1;
  BTree *pBVar2;
  int iVar3;
  uint uVar4;
  BTInnerNode *pBVar5;
  BTLeafNode *pBVar6;
  BTInnerNode *pBVar7;
  long lVar8;
  BTNode **ppBVar9;
  long lVar10;
  BTNode *pBVar11;
  BTInnerNode *pBVar12;
  bool bVar13;
  bool bVar14;
  bool err;
  int idx;
  bool err_1;
  BTNode *node;
  bool local_4d;
  int local_4c;
  BTree *local_48;
  bool local_39;
  BTNode *local_38;
  
  pBVar11 = this->root_;
  if (pBVar11 == (BTNode *)0x0) {
    uVar4 = 0;
  }
  else {
    local_48 = this;
    local_38 = pBVar11;
    iVar3 = (**pBVar11->_vptr_BTNode)(pBVar11);
    if ((char)iVar3 == '\0') {
      do {
        pBVar5 = (BTInnerNode *)__dynamic_cast(pBVar11,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
        BTInnerNode::search_node(pBVar5,key,&local_38);
        pBVar11 = local_38;
        iVar3 = (**local_38->_vptr_BTNode)(local_38);
      } while ((char)iVar3 == '\0');
    }
    if (pBVar11 == local_48->root_) {
      pBVar6 = (BTLeafNode *)__dynamic_cast(pBVar11,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      pBVar2 = local_48;
      iVar3 = (pBVar6->super_BTNode).used_links_count_;
      if (iVar3 < 3) {
        if (iVar3 != 2) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0xd4,"bool storage::BTree::_erase_(int, Record *&)");
        }
        *out_record = pBVar6->record_links_[0];
        if (local_48->root_ != (BTNode *)0x0) {
          operator_delete(local_48->root_,0xe0);
        }
        pBVar2->root_ = (BTNode *)0x0;
        uVar4 = 1;
      }
      else {
        local_39 = false;
        BTLeafNode::erase_(pBVar6,key,out_record,&local_39);
        uVar4 = (uint)local_39;
        if ((local_39 == false) && (*out_record != (Record *)0x0)) {
          __assert_fail("out_record == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0xc9,"bool storage::BTree::_erase_(int, Record *&)");
        }
      }
    }
    else {
      local_4d = false;
      if (pBVar11->parent_ == (BTNode *)0x0) {
        pBVar5 = (BTInnerNode *)0x0;
      }
      else {
        pBVar5 = (BTInnerNode *)
                 __dynamic_cast(pBVar11->parent_,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      }
      pBVar2 = local_48;
      pBVar6 = (BTLeafNode *)__dynamic_cast(pBVar11,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      local_4c = BTLeafNode::erase_(pBVar6,key,out_record,&local_4d);
      uVar4 = CONCAT31((int3)((uint)local_4c >> 8),local_4d);
      if (local_4d == true) {
        local_48 = (BTree *)CONCAT44(local_48._4_4_,uVar4);
        pBVar12 = (BTInnerNode *)0x0;
        do {
          while( true ) {
            if (local_4c == -1) goto LAB_001042e7;
            if (pBVar5 != (BTInnerNode *)0x0) break;
            pBVar5 = (BTInnerNode *)0x0;
          }
          pBVar11 = pBVar5->links_[(long)local_4c + 1];
          pBVar7 = BTInnerNode::erase_(pBVar5,local_4c,&local_4c);
          bVar13 = pBVar7 == (BTInnerNode *)0x0;
          bVar14 = local_4c != -1;
          if (bVar14 && bVar13) {
            pBVar12 = pBVar5;
            pBVar7 = pBVar5;
            if (pBVar5 != (BTInnerNode *)pBVar2->root_) {
              __assert_fail("parent == root_",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                            ,0xe5,"bool storage::BTree::_erase_(int, Record *&)");
            }
          }
          else if (pBVar11 != (BTNode *)0x0) {
            operator_delete(pBVar11,0xe0);
          }
          pBVar5 = pBVar7;
        } while (!bVar14 || !bVar13);
LAB_001042e7:
        iVar3 = local_4c;
        uVar4 = (uint)local_48;
        if (pBVar12 != (BTInnerNode *)0x0) {
          iVar1 = (pBVar12->super_BTNode).used_links_count_;
          if (iVar1 < 3) {
            if (iVar1 != 2) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                            ,0x100,"bool storage::BTree::_erase_(int, Record *&)");
            }
            if (pBVar12->links_[1] != (BTNode *)0x0) {
              operator_delete(pBVar12->links_[1],0xe0);
            }
            pBVar11 = pBVar12->links_[0];
            pBVar2->root_ = pBVar11;
            pBVar11->parent_ = (BTNode *)0x0;
            pBVar11->child_index_ = -1;
            operator_delete(pBVar12,0x278);
            uVar4 = (uint)local_48;
          }
          else {
            if (local_4c + 1 < (pBVar12->super_BTNode).used_links_count_ + -1) {
              lVar10 = (long)local_4c + 6;
              do {
                (pBVar12->super_BTNode).keys_[lVar10 + -6] =
                     (pBVar12->super_BTNode).keys_[lVar10 + -5];
                lVar8 = lVar10 + -4;
                lVar10 = lVar10 + 1;
              } while (lVar8 < (long)(pBVar12->super_BTNode).used_links_count_ + -1);
            }
            lVar10 = (long)local_4c;
            if (pBVar12->links_[lVar10 + 1] != (BTNode *)0x0) {
              operator_delete(pBVar12->links_[lVar10 + 1],0xe0);
            }
            iVar1 = (pBVar12->super_BTNode).used_links_count_;
            if (iVar3 + 2 < iVar1) {
              ppBVar9 = pBVar12->links_ + lVar10 + 2;
              do {
                iVar3 = iVar3 + 1;
                pBVar11 = *ppBVar9;
                ppBVar9[-1] = pBVar11;
                pBVar11->parent_ = &pBVar12->super_BTNode;
                pBVar11->child_index_ = iVar3;
                ppBVar9 = ppBVar9 + 1;
              } while (iVar3 - iVar1 != -2);
            }
            (pBVar12->super_BTNode).used_links_count_ = iVar1 + -1;
            bVar13 = ll(pBVar12->links_,iVar1 + -1);
            uVar4 = (uint)local_48;
            if (!bVar13) {
              __assert_fail("ll(cur->links_, cur->used_links_count_)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                            ,0xf8,"bool storage::BTree::_erase_(int, Record *&)");
            }
          }
        }
      }
      else if (*out_record != (Record *)0x0) {
        __assert_fail("out_record == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                      ,0xdb,"bool storage::BTree::_erase_(int, Record *&)");
      }
    }
  }
  return SUB41(uVar4,0);
}

Assistant:

bool BTree::_erase_(int key, Record *&out_record) {
        if (!root_) {
            return false;   /* EMPTY */
        }
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        if (node == root_) {
            auto leaf = dynamic_cast<BTLeafNode *>(node);
            if (leaf->key_count() > 1) {
                bool err = false;
                leaf->erase_(key, out_record, err);
                if (!err) {
                    assert(out_record == nullptr);
                    return false; // not exists
                } else
                    return true;

            } else if (leaf->key_count() == 1) {
                out_record = leaf->record_links_[0];
                delete root_;
                root_ = nullptr;
                return true;
            } else {
                assert(false);
            }
        }
        bool err = false;
        BTInnerNode *parent = dynamic_cast<BTInnerNode *>(node->parent_);
        int idx = dynamic_cast<BTLeafNode *>(node)->erase_(key, out_record, err);
        if (!err) {
            assert(out_record == nullptr);
            return false; // not exists
        }

        BTInnerNode *cur = nullptr;
        while (idx != -1) {
            if (parent) {
                auto tt = parent->links_[idx + 1];
                BTInnerNode *nd = parent->erase_(idx, idx);
                if (!nd && idx != -1) {
                    assert(parent == root_);
                    cur = parent;
                    break;
                } else {
                    delete tt;
                    parent = nd;
                }
            }
        }
        if (cur) {
            if (cur->used_links_count_ > 2) {
                for (int i = idx + 1; i < cur->used_links_count_ - 1; ++i) {
                    cur->keys_[i - 1] = cur->keys_[i];
                }
                delete cur->links_[idx + 1];
                for (int i = idx + 2; i < cur->used_links_count_; ++i) {
                    cur->set_link(i - 1, cur->links_[i]);
                }
                cur->used_links_count_--;
                assert(ll(cur->links_, cur->used_links_count_));
            } else if (cur->used_links_count_ == 2) {
                delete cur->links_[1];
                root_ = cur->links_[0];
                root_->parent_ = nullptr;
                root_->child_index_ = -1;
                delete cur;
            } else {
                assert(false);
            }
        }
        return true;
    }